

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O3

double __thiscall Symbol_table::get_value(Symbol_table *this,string *s)

{
  pointer pVVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  pointer pVVar3;
  string local_48;
  
  pVVar3 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pVVar3 != pVVar1) {
    __s2 = (s->_M_dataplus)._M_p;
    __n = s->_M_string_length;
    do {
      if ((pVVar3->name)._M_string_length == __n) {
        if (__n == 0) goto LAB_00102a68;
        iVar2 = bcmp((pVVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) goto LAB_00102a68;
      }
      pVVar3 = pVVar3 + 1;
    } while (pVVar3 != pVVar1);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"get: undefined name ","");
  error(&local_48,s);
  std::__cxx11::string::~string((string *)&local_48);
LAB_00102a68:
  return pVVar3->value;
}

Assistant:

double Symbol_table::get_value(const string& s)
{
	for (auto&& var : var_table)
		if (var.name == s)
			return var.value;
	error("get: undefined name ", s);
}